

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QPluginParsedMetaData>::reallocateAndGrow
          (QArrayDataPointer<QPluginParsedMetaData> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPluginParsedMetaData> *old)

{
  undefined8 *puVar1;
  QCborValue *pQVar2;
  undefined4 uVar3;
  QPluginParsedMetaData *pQVar4;
  undefined8 uVar5;
  Data *pDVar6;
  long lVar7;
  undefined1 *puVar8;
  long lVar9;
  QPluginParsedMetaData *data;
  QCborValue *other;
  long in_FS_OFFSET;
  QArrayDataPointer<QPluginParsedMetaData> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QPluginParsedMetaData *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar4 = local_48.ptr;
  if (local_48.ptr == (QPluginParsedMetaData *)0x0 && 0 < n) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      qBadAlloc();
    }
  }
  else {
    puVar8 = (undefined1 *)local_48.size;
    if (this->size != 0) {
      lVar7 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QPluginParsedMetaData> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if (0 < lVar7) {
          other = &this->ptr->data;
          pQVar2 = other + lVar7;
          do {
            QCborValue::QCborValue((QCborValue *)(pQVar4 + local_48.size),other);
            other = other + 1;
            local_48.size = local_48.size + 1;
            puVar8 = (undefined1 *)local_48.size;
          } while (other < pQVar2);
        }
      }
      else if (0 < lVar7) {
        pQVar4 = this->ptr;
        lVar9 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pQVar4->data).n + lVar9);
          *(undefined8 *)((long)&local_48.ptr[local_48.size].data.n + lVar9) = *puVar1;
          uVar5 = puVar1[1];
          puVar1[1] = 0;
          *(undefined8 *)((long)&local_48.ptr[local_48.size].data.container + lVar9) = uVar5;
          uVar3 = *(undefined4 *)(puVar1 + 2);
          *(undefined4 *)(puVar1 + 2) = 0x117;
          *(undefined4 *)((long)&local_48.ptr[local_48.size].data.t + lVar9) = uVar3;
          puVar8 = puVar8 + 1;
          lVar9 = lVar9 + 0x18;
        } while ((QPluginParsedMetaData *)(puVar1 + 3) < pQVar4 + lVar7);
      }
    }
    local_48.size = (qsizetype)puVar8;
    pDVar6 = this->d;
    pQVar4 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar8 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar6;
    local_48.ptr = pQVar4;
    local_48.size = (qsizetype)puVar8;
    if (old != (QArrayDataPointer<QPluginParsedMetaData> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar6;
      old->ptr = pQVar4;
      local_48.size = old->size;
      old->size = (qsizetype)puVar8;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }